

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpm_codec.c
# Opt level: O0

TPM_RC TSS_PolicySecret(TSS_DEVICE *tpm,TSS_SESSION *session,TPMI_DH_ENTITY authHandle,
                       TSS_SESSION *policySession,TPM2B_NONCE *nonceTPM,INT32 expiration)

{
  LOGGER_LOG p_Var1;
  LOGGER_LOG l;
  TPM2B_TIMEOUT timeout;
  TPM_RC result;
  INT32 expiration_local;
  TPM2B_NONCE *nonceTPM_local;
  TSS_SESSION *policySession_local;
  TSS_SESSION *pTStack_18;
  TPMI_DH_ENTITY authHandle_local;
  TSS_SESSION *session_local;
  TSS_DEVICE *tpm_local;
  
  timeout._62_4_ = expiration;
  _result = nonceTPM;
  nonceTPM_local = (TPM2B_NONCE *)policySession;
  policySession_local._4_4_ = authHandle;
  pTStack_18 = session;
  session_local = (TSS_SESSION *)tpm;
  if ((session == (TSS_SESSION *)0x0) || (policySession == (TSS_SESSION *)0x0)) {
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-utpm-c/src/tpm_codec.c"
                ,"TSS_PolicySecret",0x1e3,1,
                "Invalid parameter specified policySession: %p session: %p",nonceTPM_local,
                pTStack_18);
    }
    timeout._58_4_ = 0x101;
  }
  else {
    timeout._58_4_ =
         TPM2_PolicySecret(tpm,session,authHandle,(policySession->SessIn).sessionHandle,nonceTPM,
                           (TPM2B_DIGEST *)0x0,(TPM2B_NONCE *)0x0,expiration,
                           (TPM2B_TIMEOUT *)((long)&l + 6),(TPMT_TK_AUTH *)0x0);
  }
  return timeout._58_4_;
}

Assistant:

TPM_RC
TSS_PolicySecret(
    TSS_DEVICE             *tpm,                // IN/OUT
    TSS_SESSION            *session,            // IN/OUT
    TPMI_DH_ENTITY          authHandle,         // IN
    TSS_SESSION            *policySession,      // IN
    TPM2B_NONCE            *nonceTPM,           // IN
    INT32                   expiration          // IN
)
{
    TPM_RC result;
    TPM2B_TIMEOUT   timeout;
    if (session == NULL || policySession == NULL)
    {
        LogError("Invalid parameter specified policySession: %p session: %p", policySession, session);
        result = TPM_RC_FAILURE;
    }
    else
    {
        result = TPM2_PolicySecret(tpm, session, authHandle, policySession->SessIn.sessionHandle, nonceTPM, NULL, NULL, expiration, &timeout, NULL);
    }
    return result;
}